

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void setnodevector(lua_State *L,Table *t,uint size)

{
  byte bVar1;
  uint uVar2;
  Node *pNVar3;
  void *pvVar4;
  Node *n;
  char *node;
  size_t bsize;
  int local_20;
  int lsize;
  int i;
  uint size_local;
  Table *t_local;
  lua_State *L_local;
  
  if (size == 0) {
    t->node = &dummynode_;
    t->lsizenode = '\0';
    t->flags = t->flags | 0x40;
  }
  else {
    bVar1 = luaO_ceillog2(size);
    if ((0x1e < bVar1) || (0x40000000 < 1 << (bVar1 & 0x1f))) {
      luaG_runerror(L,"table overflow");
    }
    uVar2 = 1 << (bVar1 & 0x1f);
    if (bVar1 < 3) {
      pNVar3 = (Node *)luaM_malloc_(L,(ulong)uVar2 * 0x18,0);
      t->node = pNVar3;
    }
    else {
      pvVar4 = luaM_malloc_(L,(ulong)uVar2 * 0x18 + 8,0);
      t->node = (Node *)((long)pvVar4 + 8);
      *(Node **)((long)t->node + -8) = t->node + uVar2;
    }
    t->lsizenode = bVar1;
    t->flags = t->flags & 0xbf;
    for (local_20 = 0; local_20 < (int)uVar2; local_20 = local_20 + 1) {
      pNVar3 = t->node;
      (&pNVar3->u)[local_20].next = 0;
      (&pNVar3->u)[local_20].key_tt = '\0';
      (&pNVar3->u)[local_20].tt_ = '\x10';
    }
  }
  return;
}

Assistant:

static void setnodevector (lua_State *L, Table *t, unsigned size) {
  if (size == 0) {  /* no elements to hash part? */
    t->node = cast(Node *, dummynode);  /* use common 'dummynode' */
    t->lsizenode = 0;
    setdummy(t);  /* signal that it is using dummy node */
  }
  else {
    int i;
    int lsize = luaO_ceillog2(size);
    if (lsize > MAXHBITS || (1 << lsize) > MAXHSIZE)
      luaG_runerror(L, "table overflow");
    size = twoto(lsize);
    if (lsize < LIMFORLAST)  /* no 'lastfree' field? */
      t->node = luaM_newvector(L, size, Node);
    else {
      size_t bsize = size * sizeof(Node) + sizeof(Limbox);
      char *node = luaM_newblock(L, bsize);
      t->node = cast(Node *, node + sizeof(Limbox));
      getlastfree(t) = gnode(t, size);  /* all positions are free */
    }
    t->lsizenode = cast_byte(lsize);
    setnodummy(t);
    for (i = 0; i < cast_int(size); i++) {
      Node *n = gnode(t, i);
      gnext(n) = 0;
      setnilkey(n);
      setempty(gval(n));
    }
  }
}